

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopicTree.h
# Opt level: O2

void __thiscall uWS::TopicTree::~TopicTree(TopicTree *this)

{
  Topic *this_00;
  
  this_00 = this->root;
  if (this_00 != (Topic *)0x0) {
    Topic::~Topic(this_00);
  }
  operator_delete(this_00,0xc0);
  std::_Function_base::~_Function_base((_Function_base *)this);
  return;
}

Assistant:

~TopicTree() {
        delete root;
    }